

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  thread *this;
  forwarder *__f;
  ostream *poVar3;
  void *this_00;
  char **in_RSI;
  int in_EDI;
  exception *e;
  thread fw_thread;
  forwarder fw;
  bool internal;
  service srv;
  undefined1 in_stack_000004ef;
  forwarder *in_stack_000004f0;
  forwarder *in_stack_ffffffffffffff18;
  forwarder *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  function<void_()> *in_stack_ffffffffffffff30;
  submitter local_60 [5];
  undefined1 local_38 [32];
  service local_18 [20];
  int local_4;
  
  local_4 = 0;
  cppcms::service::service(local_18,in_EDI,in_RSI);
  uVar2 = cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  cppcms::applications_pool::mount(uVar2,local_38,0);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10b6f5);
  this = (thread *)cppcms::service::settings();
  __f = (forwarder *)cppcms::json::value::find((char *)this);
  iVar1 = cppcms::json::value::type();
  if (iVar1 == 4) {
    submitter::submitter(local_60,local_18);
    std::function<void()>::function<submitter,void>
              (in_stack_ffffffffffffff30,
               (submitter *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    cppcms::service::after_fork((function *)local_18);
    std::function<void_()>::~function((function<void_()> *)0x10b790);
  }
  cppcms::service::settings();
  cppcms::json::value::get<bool>
            ((value *)in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18);
  forwarder::forwarder(in_stack_000004f0,(bool)in_stack_000004ef);
  std::thread::thread<forwarder&,,void>(this,__f);
  cppcms::service::run();
  forwarder::service(in_stack_ffffffffffffff18);
  std::__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cppcms::service,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10b89a);
  cppcms::service::shutdown();
  std::shared_ptr<cppcms::service>::~shared_ptr((shared_ptr<cppcms::service> *)0x10b8ae);
  std::thread::join();
  std::thread::~thread((thread *)0x10b8c4);
  forwarder::~forwarder(in_stack_ffffffffffffff20);
  cppcms::service::~service(local_18);
  if (((run_ok & 1U) == 0) || ((fw_ok & 1U) == 0)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed run=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(run_ok & 1));
    poVar3 = std::operator<<(poVar3," forwarder=");
    this_00 = (void *)std::ostream::operator<<(poVar3,(bool)(fw_ok & 1));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Done Ok");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int main(int argc,char **argv) 
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( cppcms::create_pool<unit_test>());
		if(srv.settings().find("test.exec").type()==cppcms::json::is_string)
			srv.after_fork(submitter(srv));
	
		bool internal=srv.settings().get<bool>("test.internal");	
		forwarder fw(internal);
		booster::thread fw_thread(fw);
		
		srv.run();
		fw.service()->shutdown();
		fw_thread.join();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(run_ok  && fw_ok) {
		std::cout << "Done Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cerr << "Failed run=" << run_ok << " forwarder=" << fw_ok << std::endl;
		return EXIT_FAILURE;
	}
}